

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdSocket.cpp
# Opt level: O0

size_t __thiscall UdpSocketImpl::Write(UdpSocketImpl *this,void *buf,size_t len,string *strTo)

{
  string *__n;
  size_t __first;
  byte bVar1;
  bool bVar2;
  type __result;
  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> local_40;
  __array tmp;
  int iRet;
  string *strTo_local;
  size_t len_local;
  void *buf_local;
  UdpSocketImpl *this_local;
  
  if ((((((this->super_BaseSocketImpl).m_bStop & 1U) != 1) && ((this->m_bCloseReq & 1U) != 1)) &&
      (buf != (void *)0x0)) &&
     ((len != 0 &&
      (strTo_local = (string *)len, len_local = (size_t)buf, buf_local = this,
      bVar1 = std::__cxx11::string::empty(), (bVar1 & 1) != 1)))) {
    tmp._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
    super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
    super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl._4_4_ = 0;
    bVar2 = std::operator==(&this->m_fnSslEncode,(nullptr_t)0x0);
    if ((bVar2) ||
       (tmp._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
        super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
        super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl._4_4_ =
             std::
             function<int_(const_unsigned_char_*,_unsigned_long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
             ::operator()(&this->m_fnSslEncode,(uchar *)len_local,(unsigned_long)strTo_local,strTo),
       tmp._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
       super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
       super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl._4_4_ == 0)) {
      std::make_unique<unsigned_char[]>((size_t)&local_40);
      __first = len_local;
      __n = strTo_local;
      __result = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::operator[]
                           (&local_40,0);
      std::copy_n<unsigned_char_const*,unsigned_long,unsigned_char*>
                ((uchar *)__first,(unsigned_long)__n,__result);
      std::mutex::lock(&this->m_mxOutDeque);
      std::__atomic_base<unsigned_long>::operator+=
                (&(this->m_atOutBytes).super___atomic_base<unsigned_long>,(__int_type)strTo_local);
      std::
      deque<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long,std::__cxx11::string>,std::allocator<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long,std::__cxx11::string>>>
      ::
      emplace_back<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long&,std::__cxx11::string_const&>
                ((deque<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long,std::__cxx11::string>,std::allocator<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long,std::__cxx11::string>>>
                  *)&this->m_quOutData,&local_40,(unsigned_long *)&strTo_local,strTo);
      std::mutex::unlock(&this->m_mxOutDeque);
      tmp._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
      super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
      super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl._4_4_ = 1;
      std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr
                (&local_40);
    }
    if (0 < tmp._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
            _M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
            super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl._4_4_) {
      TriggerWriteThread(this);
    }
    return (size_t)strTo_local;
  }
  return 0;
}

Assistant:

size_t UdpSocketImpl::Write(const void* buf, size_t len, const string& strTo)
{
    if (m_bStop == true || m_bCloseReq == true || buf == nullptr || len == 0 || strTo.empty() == true)
        return 0;

    int iRet = 0;
    if (m_fnSslEncode == nullptr || (iRet = m_fnSslEncode(reinterpret_cast<const uint8_t*>(buf), len, strTo), iRet == 0))
    {
        auto tmp = make_unique<uint8_t[]>(len);
        copy_n(&static_cast<const uint8_t*>(buf)[0], len, &tmp[0]);
        m_mxOutDeque.lock();
        m_atOutBytes += len;
        m_quOutData.emplace_back(move(tmp), len, strTo);
        m_mxOutDeque.unlock();

        iRet = 1;   // Trigger WriteThread
    }

    if (iRet > 0)
        TriggerWriteThread();

    return len;
}